

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

RecyclerWeakReference<Js::EntryPointInfo> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
         *this,EntryPointInfo *key,uchar value,bool add,bool checkForExisting)

{
  uint uVar1;
  WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> *pWVar2;
  EntryPointInfo *pEVar3;
  Recycler *recycler;
  hash_t bucket;
  int iVar4;
  int previous;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  RecyclerWeakReferenceBase *weakRef;
  RecyclerWeakReference<Js::EntryPointInfo> *pRVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  uint key_00;
  byte bVar8;
  
  uVar7 = CONCAT71(in_register_00000011,value) & 0xffffffff;
  iVar4 = (int)CONCAT71(in_register_00000011,value);
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  bucket = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  pRVar6 = (RecyclerWeakReference<Js::EntryPointInfo> *)CONCAT44(extraout_var,bucket);
  if (!checkForExisting) goto LAB_007ce8c3;
  if ((this->buckets).ptr == (int *)0x0) {
LAB_007ce877:
    iVar4 = -1;
  }
  else {
    Memory::Recycler::IsSweeping(this->recycler);
    uVar1 = (this->buckets).ptr[bucket];
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      pRVar6 = (RecyclerWeakReference<Js::EntryPointInfo> *)CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
    }
    else {
      previous = -1;
      do {
        pWVar2 = (this->entries).ptr;
        if (pWVar2[uVar5 & 0xffffffff].hash == key_00) {
          pEVar3 = (EntryPointInfo *)
                   ((pWVar2[uVar5 & 0xffffffff].key.ptr)->super_RecyclerWeakReferenceBase).strongRef
          ;
          if (pEVar3 == (EntryPointInfo *)0x0) {
            iVar4 = RemoveEntry(this,(int)uVar5,previous,bucket);
            uVar5 = CONCAT44(extraout_var_00,iVar4);
            bVar8 = 3;
          }
          else {
            bVar8 = pEVar3 == key;
            if ((bool)bVar8) {
              uVar7 = uVar5 & 0xffffffff;
            }
          }
          iVar4 = (int)uVar7;
          if (bVar8 == 0) goto LAB_007ce84f;
          if (bVar8 != 3) goto LAB_007ce869;
        }
        else {
LAB_007ce84f:
          previous = (int)uVar5;
          uVar5 = (ulong)(uint)(this->entries).ptr[previous].next;
        }
        iVar4 = (int)uVar7;
      } while (-1 < (int)uVar5);
      bVar8 = 0;
LAB_007ce869:
      pRVar6 = (RecyclerWeakReference<Js::EntryPointInfo> *)
               CONCAT71((int7)(uVar5 >> 8),(bVar8 & 1) == 0);
    }
    if ((char)pRVar6 != '\0') goto LAB_007ce877;
  }
  if (iVar4 != -1) {
    if (add) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pWVar2 = (this->entries).ptr;
    pWVar2[iVar4].value = value;
    this->version = this->version + 1;
    pRVar6 = pWVar2[iVar4].key.ptr;
  }
  if (iVar4 != -1) {
    return pRVar6;
  }
LAB_007ce8c3:
  recycler = this->recycler;
  weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                      (&recycler->weakReferenceMap,(char *)key,recycler);
  if (weakRef->typeInfo == (Type)0x0) {
    weakRef->typeInfo = (Type)&Js::EntryPointInfo::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
  }
  pRVar6 = Insert(this,(RecyclerWeakReference<Js::EntryPointInfo> *)weakRef,value,key_00,bucket);
  return pRVar6;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }